

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderInvarianceTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::anon_unknown_1::InvarianceTest::init
          (InvarianceTest *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 err;
  int extraout_EAX;
  RenderTarget *pRVar4;
  NotSupportedError *this_00;
  ShaderProgram *pSVar5;
  RenderContext *pRVar6;
  ProgramSources *pPVar7;
  TestLog *pTVar8;
  TestError *pTVar9;
  MessageBuilder *pMVar10;
  long lVar11;
  reference pvVar12;
  size_type sVar13;
  undefined8 local_7d8;
  undefined8 local_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  int local_7a8;
  int triNdx_1;
  Vector<float,_4> local_794;
  undefined8 local_784;
  Vec4 vertex3;
  Vec4 vertex2;
  Vec4 vertex1;
  int triNdx;
  Functions *gl;
  undefined1 local_740 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> triangles;
  Random rnd;
  int numTriangles;
  MessageBuilder local_590;
  undefined1 local_40a;
  allocator<char> local_409;
  string local_408;
  undefined1 local_3e1;
  ShaderSource local_3e0;
  ShaderSource local_3b8;
  ProgramSources local_390;
  undefined1 local_2ba;
  allocator<char> local_2b9;
  string local_2b8;
  undefined1 local_291;
  ShaderSource local_290;
  ShaderSource local_268;
  ProgramSources local_240;
  undefined1 local_170 [8];
  ShaderPair vertexShaders;
  string local_e8;
  string local_c8;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  InvarianceTest *local_10;
  InvarianceTest *this_local;
  undefined4 extraout_var;
  
  local_10 = this;
  pRVar4 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = tcu::RenderTarget::getWidth(pRVar4);
  if (this->m_renderSize <= iVar3) {
    pRVar4 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar3 = tcu::RenderTarget::getHeight(pRVar4);
    if (this->m_renderSize <= iVar3) {
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(local_170);
      pSVar5 = (ShaderProgram *)operator_new(0xd0);
      local_291 = 1;
      pRVar6 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
      glu::ProgramSources::ProgramSources(&local_240);
      glu::VertexSource::VertexSource((VertexSource *)&local_268,(string *)local_170);
      pPVar7 = glu::ProgramSources::operator<<(&local_240,&local_268);
      glu::FragmentSource::FragmentSource
                ((FragmentSource *)&local_290,
                 (string *)((long)&vertexShaders.vertexShaderSource0.field_2 + 8));
      pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_290);
      glu::ShaderProgram::ShaderProgram(pSVar5,pRVar6,pPVar7);
      local_291 = 0;
      this->m_shader0 = pSVar5;
      glu::FragmentSource::~FragmentSource((FragmentSource *)&local_290);
      glu::VertexSource::~VertexSource((VertexSource *)&local_268);
      glu::ProgramSources::~ProgramSources(&local_240);
      bVar2 = glu::ShaderProgram::isOk(this->m_shader0);
      if (!bVar2) {
        pTVar8 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        glu::operator<<(pTVar8,this->m_shader0);
        local_2ba = 1;
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b8,"Test shader compile failed.",&local_2b9);
        tcu::TestError::TestError(pTVar9,&local_2b8);
        local_2ba = 0;
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      pSVar5 = (ShaderProgram *)operator_new(0xd0);
      local_3e1 = 1;
      pRVar6 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
      glu::ProgramSources::ProgramSources(&local_390);
      glu::VertexSource::VertexSource
                ((VertexSource *)&local_3b8,
                 (string *)((long)&vertexShaders.fragmentShaderSource0.field_2 + 8));
      pPVar7 = glu::ProgramSources::operator<<(&local_390,&local_3b8);
      glu::FragmentSource::FragmentSource
                ((FragmentSource *)&local_3e0,
                 (string *)((long)&vertexShaders.vertexShaderSource1.field_2 + 8));
      pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_3e0);
      glu::ShaderProgram::ShaderProgram(pSVar5,pRVar6,pPVar7);
      local_3e1 = 0;
      this->m_shader1 = pSVar5;
      glu::FragmentSource::~FragmentSource((FragmentSource *)&local_3e0);
      glu::VertexSource::~VertexSource((VertexSource *)&local_3b8);
      glu::ProgramSources::~ProgramSources(&local_390);
      bVar2 = glu::ShaderProgram::isOk(this->m_shader1);
      if (!bVar2) {
        pTVar8 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        glu::operator<<(pTVar8,this->m_shader1);
        local_40a = 1;
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_408,"Test shader compile failed.",&local_409);
        tcu::TestError::TestError(pTVar9,&local_408);
        local_40a = 0;
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&rnd.m_rnd.w,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&rnd.m_rnd.w,(char (*) [10])"Shader 1:");
      pTVar8 = tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      pTVar8 = glu::operator<<(pTVar8,this->m_shader0);
      tcu::TestLog::operator<<(&local_590,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<(&local_590,(char (*) [10])"Shader 2:");
      pTVar8 = tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      glu::operator<<(pTVar8,this->m_shader1);
      tcu::MessageBuilder::~MessageBuilder(&local_590);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&rnd.m_rnd.w);
      ShaderPair::~ShaderPair((ShaderPair *)local_170);
      rnd.m_rnd.z = 0x48;
      de::Random::Random((Random *)
                         ((long)&triangles.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0x7b);
      std::allocator<tcu::Vector<float,_4>_>::allocator
                ((allocator<tcu::Vector<float,_4>_> *)((long)&gl + 7));
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_740
                 ,0x1b0,(allocator<tcu::Vector<float,_4>_> *)((long)&gl + 7));
      std::allocator<tcu::Vector<float,_4>_>::~allocator
                ((allocator<tcu::Vector<float,_4>_> *)((long)&gl + 7));
      pRVar6 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
      iVar3 = (*pRVar6->_vptr_RenderContext[3])();
      lVar11 = CONCAT44(extraout_var,iVar3);
      for (vertex1.m_data[2] = 0.0; (int)vertex1.m_data[2] < 0x48;
          vertex1.m_data[2] = (float)((int)vertex1.m_data[2] + 1)) {
        genRandomVector((anon_unknown_1 *)(vertex2.m_data + 2),
                        (Random *)
                        ((long)&triangles.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        genRandomVector((anon_unknown_1 *)(vertex3.m_data + 2),
                        (Random *)
                        ((long)&triangles.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        genRandomVector((anon_unknown_1 *)&stack0xfffffffffffff85c,
                        (Random *)
                        ((long)&triangles.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        tcu::operator*((tcu *)&local_794,(Vector<float,_4> *)&stack0xfffffffffffff85c,0.01);
        tcu::operator+((tcu *)&local_784,(Vector<float,_4> *)(vertex3.m_data + 2),&local_794);
        pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                  operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              *)local_740,(long)((int)vertex1.m_data[2] * 3));
        *(undefined8 *)pvVar12->m_data = vertex2.m_data._8_8_;
        *(undefined8 *)(pvVar12->m_data + 2) = vertex1.m_data._0_8_;
        pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                  operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              *)local_740,(long)((int)vertex1.m_data[2] * 3 + 1));
        *(undefined8 *)pvVar12->m_data = vertex3.m_data._8_8_;
        *(undefined8 *)(pvVar12->m_data + 2) = vertex2.m_data._0_8_;
        pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                  operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              *)local_740,(long)((int)vertex1.m_data[2] * 3 + 2));
        *(undefined8 *)pvVar12->m_data = local_784;
        *(undefined8 *)(pvVar12->m_data + 2) = vertex3.m_data._0_8_;
      }
      for (local_7a8 = 0; local_7a8 < 0x48; local_7a8 = local_7a8 + 1) {
        genRandomVector((anon_unknown_1 *)&local_7b8,
                        (Random *)
                        ((long)&triangles.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                  operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              *)local_740,(long)(local_7a8 * 3 + 0xd8));
        *(undefined8 *)pvVar12->m_data = local_7b8;
        *(undefined8 *)(pvVar12->m_data + 2) = uStack_7b0;
        genRandomVector((anon_unknown_1 *)&local_7c8,
                        (Random *)
                        ((long)&triangles.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                  operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              *)local_740,(long)(local_7a8 * 3 + 0xd9));
        *(undefined8 *)pvVar12->m_data = local_7c8;
        *(undefined8 *)(pvVar12->m_data + 2) = uStack_7c0;
        genRandomVector((anon_unknown_1 *)&local_7d8,
                        (Random *)
                        ((long)&triangles.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                  operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              *)local_740,(long)((local_7a8 + 0x48) * 3 + 2));
        *(undefined8 *)pvVar12->m_data = local_7d8;
        *(undefined8 *)(pvVar12->m_data + 2) = local_7d0;
      }
      (**(code **)(lVar11 + 0x6c8))(1,&this->m_arrayBuf);
      (**(code **)(lVar11 + 0x40))(0x8892,this->m_arrayBuf);
      pcVar1 = *(code **)(lVar11 + 0x150);
      sVar13 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                         ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_740);
      pvVar12 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_740,0);
      (*pcVar1)(0x8892,(long)((int)sVar13 << 4),pvVar12,0x88e4);
      err = (**(code **)(lVar11 + 0x800))();
      glu::checkError(err,"buffer gen",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderInvarianceTests.cpp"
                      ,0xeb);
      this->m_verticesInPattern = 0xd8;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_740
                );
      de::Random::~Random((Random *)
                          ((long)&triangles.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      return extraout_EAX;
    }
  }
  vertexShaders.fragmentShaderSource1.field_2._M_local_buf[0xf] = '\x01';
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"Render target size must be at least ",&local_91);
  de::toString<int>(&local_c8,&this->m_renderSize);
  std::operator+(&local_70,&local_90,&local_c8);
  std::operator+(&local_50,&local_70,"x");
  de::toString<int>(&local_e8,&this->m_renderSize);
  std::operator+(&local_30,&local_50,&local_e8);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
  vertexShaders.fragmentShaderSource1.field_2._M_local_buf[0xf] = '\0';
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void InvarianceTest::init (void)
{
	// Invariance tests require drawing to the screen and reading back results.
	// Tests results are not reliable if the resolution is too small
	{
		if (m_context.getRenderTarget().getWidth()  < m_renderSize ||
			m_context.getRenderTarget().getHeight() < m_renderSize)
			throw tcu::NotSupportedError(std::string("Render target size must be at least ") + de::toString(m_renderSize) + "x" + de::toString(m_renderSize));
	}

	// Gen shaders
	{
		ShaderPair vertexShaders = genShaders();

		m_shader0 = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vertexShaders.vertexShaderSource0) << glu::FragmentSource(vertexShaders.fragmentShaderSource0));
		if (!m_shader0->isOk())
		{
			m_testCtx.getLog() << *m_shader0;
			throw tcu::TestError("Test shader compile failed.");
		}

		m_shader1 = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vertexShaders.vertexShaderSource1) << glu::FragmentSource(vertexShaders.fragmentShaderSource1));
		if (!m_shader1->isOk())
		{
			m_testCtx.getLog() << *m_shader1;
			throw tcu::TestError("Test shader compile failed.");
		}

		// log
		m_testCtx.getLog()
			<< tcu::TestLog::Message << "Shader 1:" << tcu::TestLog::EndMessage
			<< *m_shader0
			<< tcu::TestLog::Message << "Shader 2:" << tcu::TestLog::EndMessage
			<< *m_shader1;
	}

	// Gen test pattern
	{
		const int				numTriangles	= 72;
		de::Random				rnd				(123);
		std::vector<tcu::Vec4>	triangles		(numTriangles * 3 * 2);
		const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();

		// Narrow triangle pattern
		for (int triNdx = 0; triNdx < numTriangles; ++triNdx)
		{
			const tcu::Vec4 vertex1 = genRandomVector(rnd);
			const tcu::Vec4 vertex2 = genRandomVector(rnd);
			const tcu::Vec4 vertex3 = vertex2 + genRandomVector(rnd) * 0.01f; // generate narrow triangles

			triangles[triNdx*3 + 0] = vertex1;
			triangles[triNdx*3 + 1] = vertex2;
			triangles[triNdx*3 + 2] = vertex3;
		}

		// Normal triangle pattern
		for (int triNdx = 0; triNdx < numTriangles; ++triNdx)
		{
			triangles[(numTriangles + triNdx)*3 + 0] = genRandomVector(rnd);
			triangles[(numTriangles + triNdx)*3 + 1] = genRandomVector(rnd);
			triangles[(numTriangles + triNdx)*3 + 2] = genRandomVector(rnd);
		}

		// upload
		gl.genBuffers(1, &m_arrayBuf);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_arrayBuf);
		gl.bufferData(GL_ARRAY_BUFFER, (int)(triangles.size() * sizeof(tcu::Vec4)), &triangles[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "buffer gen");

		m_verticesInPattern = numTriangles * 3;
	}
}